

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r6p_iter.cpp
# Opt level: O2

int R6PIter(MatrixXd *X,MatrixXd *u,Vector3d *vk,double r0,RSDoublelinCameraPoseVector *results)

{
  double dVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>
  local_1968;
  Matrix<double,_12,_13,_0,_12,_13> A;
  MatrixXd n;
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_10b0 [32];
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_1090 [32];
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_1070 [32];
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_1050 [32];
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_1030 [32];
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_1010 [32];
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_ff0 [32];
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_fd0 [32];
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_fb0 [32];
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_f90 [32];
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_f70 [32];
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_f50 [32];
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_f30 [32];
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_f10 [32];
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_ef0 [32];
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_ed0 [32];
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_eb0 [32];
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_e90 [32];
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_e70 [32];
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_e50 [32];
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_e30 [32];
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,_1,1,false>>
  local_e10 [32];
  Vector3d C;
  Vector3d w;
  FullPivLU<Eigen::Matrix<double,_12,_13,_0,_12,_13>_> local_ac8;
  Vector3d t;
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>
  local_3b0 [8];
  double *local_3a8;
  Index local_398;
  MatrixXd *local_390;
  undefined8 local_388;
  undefined8 local_380;
  undefined8 local_378;
  Index local_370;
  double local_360;
  double *local_350;
  Index local_340;
  MatrixXd *local_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>
  local_308 [8];
  double *local_300;
  Index local_2f0;
  MatrixXd *local_2e8;
  undefined8 local_2e0;
  undefined8 local_2d8;
  undefined8 local_2d0;
  Index local_2c8;
  double local_2b8;
  double *local_2a8;
  double local_298;
  MatrixXd *local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  undefined8 local_278;
  Vector3d v;
  
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[1] = 0.0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,12,13,0,12,13>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,12,13,0,12,13>>>
            ((PlainObjectBase<Eigen::Matrix<double,12,13,0,12,13>> *)&A,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_12,_13,_0,_12,_13>_>_>
              *)&local_ac8);
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 6;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = (double)(X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                     .m_data;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[2] = (double)(X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                     .m_cols;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0] = (double)((long)local_ac8.m_lu.
                            super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
                            m_storage.m_data.array[7] + 0x10);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x10] = (double)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_cols;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[4] = 9.88131291682493e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[5] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = (double)((long)local_ac8.m_lu.
                            super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
                            m_storage.m_data.array[7] + 8);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xe] = (double)((u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_data + 1);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xb] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xc] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xd] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x12] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x13] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x14] = 4.94065645841247e-324;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data = (double *)&A
  ;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = (double)X;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
             m_storage.m_data.array[2];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[10] = (double)X;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x11] = (double)u;
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>>
            (local_e10,
             (Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>
              *)&n,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>
                    *)&local_ac8);
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.array + 6
  ;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 6;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = (double)(X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                     .m_cols;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[1] = (double)((X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_data + 1);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = (double)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                     .m_data;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xb] = (double)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_cols;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[5] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xd] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xe] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xf] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[4] = (double)X;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xc] = (double)u;
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>>
            (local_e30,
             (Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>
              *)&n,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>
                    *)&local_ac8);
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.array +
       0xc;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 6;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[1] = (double)(X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                     .m_data;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = (double)(X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                     .m_cols;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xb] = (double)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_cols;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = (double)((u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_data + 1);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[5] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xd] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xe] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xf] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[4] = (double)X;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xc] = (double)u;
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>>
            (local_e50,
             (Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>
              *)&n,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>
                    *)&local_ac8);
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.array +
       0x12;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 6;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = (double)(X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                     .m_data;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[2] = (double)(X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                     .m_cols;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0] = (double)((long)local_ac8.m_lu.
                            super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
                            m_storage.m_data.array[7] + 0x10);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xe] = (double)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_data;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x10] = (double)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_cols;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[4] = 9.88131291682493e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[5] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xb] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xc] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xd] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x12] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x13] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x14] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = (double)X;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
             m_storage.m_data.array[2];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[10] = (double)X;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x11] = (double)u;
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>>
            (local_e70,
             (Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>
              *)&n,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>
                    *)&local_ac8);
  pdVar2 = A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.array
           + 0x18;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[1] = 2.96439387504748e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[5] = (double)&A;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = 9.88131291682493e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[8] = 5.92878775009496e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xb] = 5.92878775009496e-323;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0] = (double)pdVar2;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = (double)pdVar2;
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>>
            (local_e90,
             (Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>
              *)&local_ac8,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>
              *)&n);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0] = (double)(A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
                      m_data.array + 0x1e);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[1] = 2.96439387504748e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = 9.88131291682493e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[8] = 5.92878775009496e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = 2.96439387504748e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xb] = 5.92878775009496e-323;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data + 1;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = (double)pdVar2;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[5] = (double)&A;
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>>
            (local_eb0,
             (Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>
              *)&local_ac8,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>
              *)&n);
  local_1968.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_0>
  .m_data = A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
            array + 0x24;
  local_1968.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_0>
  .m_rows.m_value = 6;
  local_1968.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_1968.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_startCol.
  m_value = 3;
  local_1968.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_outerStride =
       0xc;
  local_1968.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_startRow.m_value = 0;
  local_1968.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_outerStride = 0xc;
  C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)(X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
  local_2f0 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
  ;
  local_2a8 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
  ;
  dVar1 = (double)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                  m_cols;
  local_300 = (double *)
              ((long)C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                     .array[2] + 0x10);
  t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)((long)C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array[2] + 8);
  local_2b8 = (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0];
  local_2e0 = 2;
  local_2d8 = 0;
  local_2d0 = 1;
  pdVar2 = local_2a8 + 1;
  local_288 = 0;
  uStack_280 = 0;
  local_278 = 1;
  local_1968.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,_0>.m_data =
       local_1968.
       super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
       .
       super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_1>
       .
       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_0>
       .m_data;
  local_1968.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_xpr = &A;
  local_2e8 = X;
  local_2c8 = local_2f0;
  local_298 = dVar1;
  local_290 = u;
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>const>const>>
  ::operator-((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>
               *)&w,(ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const>>
                     *)&t,local_308);
  v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)pdVar2;
  v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = dVar1;
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>const>const>>
  ::operator-((CwiseBinaryOp<_2ae976c5_> *)&n,
              (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const>>
               *)&C,(ArrayBase<_1893ba9_> *)&v);
  local_398 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
  ;
  local_3a8 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
              + 1;
  local_360 = (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0];
  local_350 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
  ;
  local_340 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
  ;
  local_388 = 1;
  local_380 = 0;
  local_378 = 1;
  local_330 = 0;
  uStack_328 = 0;
  local_320 = 1;
  local_390 = X;
  local_370 = local_398;
  local_338 = u;
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayW...lock<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>const>const>const>const>>
  ::operator-((CwiseBinaryOp<_5843b2c2_> *)&local_ac8,
              (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayW___lock<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const>const>const>>
               *)&n,local_3b0);
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>co___ose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const>>
            (local_ed0,&local_1968,(DenseBase<_71835ddd_> *)&local_ac8);
  C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)(A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
                array + 0x2a);
  C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       2.96439387504748e-323;
  pdVar2 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  dVar1 = (double)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                  m_cols;
  pdVar3 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)(pdVar3 + 1);
  w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)(pdVar3 + 2);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>const>const>>
  ::operator-((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>
               *)&n,(ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const>>
                     *)&v,
              (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>
               *)&w);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[4] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[5] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = (double)n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_cols;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xb] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xc] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xd] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xe] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xf] = 5.92878775009496e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x10] = 2.96439387504748e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x12] = 5.92878775009496e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0] = (double)pdVar2;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[2] = dVar1;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = (double)u;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[10] = (double)X;
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const>const>>
            (local_ef0,
             (Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>
              *)&C,(DenseBase<_1893ba9_> *)&local_ac8);
  C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)(A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
                array + 0x30);
  C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       2.96439387504748e-323;
  pdVar2 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  dVar1 = (double)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                  m_cols;
  v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)(X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
  w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)((long)v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                      m_data.array[1] + 0x10);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>
               *)&n,(ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const>>
                     *)&v,
              (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>
               *)&w);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[4] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[5] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = (double)n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_cols;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xb] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xc] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xd] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xe] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xf] = 5.92878775009496e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x10] = 2.96439387504748e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x12] = 5.92878775009496e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0] = (double)(pdVar2 + 1);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[2] = dVar1;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = (double)u;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[10] = (double)X;
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const>const>>
            (local_f10,
             (Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>
              *)&C,(DenseBase<_6622591b_> *)&local_ac8);
  local_1968.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_0>
  .m_data = A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
            array + 0x36;
  local_1968.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_1>
  .
  super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>,_0>
  .m_rows.m_value = 6;
  local_1968.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,_0>.m_data =
       A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.array +
       0x30;
  local_1968.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_xpr = &A;
  local_1968.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_startRow.
  m_value = 0;
  local_1968.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_startCol.
  m_value = 4;
  local_1968.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_xpr.super_BlockImpl<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true,_true>.m_outerStride =
       0xc;
  local_1968.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_startRow.m_value = 6;
  local_1968.
  super_BlockImpl<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_Eigen::Dense>
  .
  super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false,_true>
  .m_outerStride = 0xc;
  C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)(X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_data;
  local_2f0 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
  ;
  local_2b8 = (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[1];
  pdVar2 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  dVar1 = (double)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                  m_cols;
  local_300 = (double *)
              ((long)C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                     .array[2] + 0x10);
  local_2e0 = 2;
  local_2d8 = 0;
  local_2d0 = 1;
  local_288 = 0;
  uStack_280 = 0;
  local_278 = 1;
  t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  local_2e8 = X;
  local_2c8 = local_2f0;
  local_2a8 = pdVar2;
  local_298 = dVar1;
  local_290 = u;
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>
               *)&w,(ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const>>
                     *)&t,local_308);
  v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)pdVar2;
  v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] = dVar1;
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>const>const>>
  ::operator-((CwiseBinaryOp<_8f829437_> *)&n,
              (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const>>
               *)&C,(ArrayBase<_6622591b_> *)&v);
  local_398 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
  ;
  local_3a8 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
              + 1;
  local_360 = (vk->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
              array[0];
  local_350 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
  ;
  local_340 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
  ;
  local_388 = 1;
  local_380 = 0;
  local_378 = 1;
  local_330 = 0;
  uStack_328 = 0;
  local_320 = 1;
  local_390 = X;
  local_370 = local_398;
  local_338 = u;
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayW...lock<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>const>const>const>const>>
  ::operator-((CwiseBinaryOp<_f33f4410_> *)&local_ac8,
              (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayW___lock<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const>const>const>>
               *)&n,local_3b0);
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>co___ose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const>>
            (local_f30,&local_1968,(DenseBase<_3bdfd3ab_> *)&local_ac8);
  w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)(A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
                array + 0x3c);
  w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       2.96439387504748e-323;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       (Index)(X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
  ;
  v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)(n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
               + 0x10);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>const>const>>
  ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>
               *)&local_ac8,
              (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const>>
               *)&n,(ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>
                     *)&v);
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const>>
            (local_f50,
             (Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>
              *)&w,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>_>
                    *)&local_ac8);
  w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       (double)(A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
                array + 0x42);
  w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       2.96439387504748e-323;
  pdVar2 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       (Index)(pdVar2 + 1);
  v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       (double)(pdVar2 + 2);
  Eigen::
  ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,-1,1,0,-1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>const,1,-1,false>const>const>const>const>const>>
  ::operator-((CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>
               *)&local_ac8,
              (ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const>>
               *)&n,(ArrayBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>
                     *)&v);
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>const>>
            (local_f70,
             (Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>
              *)&w,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>_>
                    *)&local_ac8);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = (double)(A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
                      m_data.array + 0x48);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0] = (double)(A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
                      m_data.array + 0x4e);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[1] = 2.96439387504748e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = 2.96439387504748e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[8] = 5.92878775009496e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = 2.96439387504748e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xb] = 5.92878775009496e-323;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x6;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 1;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0x3ff0000000000000;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[5] = (double)&A;
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            (local_f90,
             (Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>
              *)&local_ac8,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&n);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0] = (double)(A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
                      m_data.array + 0x54);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[1] = 2.96439387504748e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = 3.45845952088873e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[8] = 5.92878775009496e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xb] = 5.92878775009496e-323;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 6;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 1;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
             m_storage.m_data.array[0];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[5] = (double)&A;
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>const>>
            (local_fb0,
             (Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>
              *)&local_ac8,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
              *)&n);
  pdVar2 = A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.array
           + 0x60;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[1] = 2.96439387504748e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = 3.95252516672997e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[8] = 5.92878775009496e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xb] = 5.92878775009496e-323;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data + 1;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0] = (double)pdVar2;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = (double)pdVar2;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[5] = (double)&A;
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>>
            (local_fd0,
             (Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>
              *)&local_ac8,
             (DenseBase<Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
              *)&n);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0] = (double)(A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
                      m_data.array + 0x66);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[1] = 2.96439387504748e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = 3.95252516672997e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[8] = 5.92878775009496e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = 2.96439387504748e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xb] = 5.92878775009496e-323;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = (double)pdVar2;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[5] = (double)&A;
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>>
            (local_ff0,
             (Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>
              *)&local_ac8,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>
              *)&n);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = (double)(A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
                      m_data.array + 0x6c);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0] = (double)(A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
                      m_data.array + 0x72);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[1] = 2.96439387504748e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = 4.44659081257122e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[8] = 5.92878775009496e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = 2.96439387504748e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xb] = 5.92878775009496e-323;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[5] = (double)&A;
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>>
            (local_1010,
             (Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>
              *)&local_ac8,
             (DenseBase<Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>
              *)&n);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0] = (double)(A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.
                      m_data.array + 0x78);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[1] = 2.96439387504748e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = 4.94065645841247e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[8] = 5.92878775009496e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xb] = 5.92878775009496e-323;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
             m_storage.m_data.array[0];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[5] = (double)&A;
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>>
            (local_1030,
             (Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>
              *)&local_ac8,
             (DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>
              *)&n);
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.array +
       0x84;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 6;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = (double)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                     .m_data;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = (double)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                     .m_cols;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[1] = (double)((long)local_ac8.m_lu.
                            super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
                            m_storage.m_data.array[9] + 8);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[5] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xd] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xe] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xf] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[4] = (double)u;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xb] = local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
               m_storage.m_data.array[3];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xc] = (double)u;
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>>
            (local_1050,
             (Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>
              *)&n,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>
                    *)&local_ac8);
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.array +
       0x8a;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 6;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0] = (double)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                     .m_data;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[2] = (double)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                     .m_cols;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[4] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[5] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xb] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xc] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xd] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = (double)u;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
             m_storage.m_data.array[0];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
             m_storage.m_data.array[2];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[10] = (double)u;
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>>
            (local_1070,
             (Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>
              *)&n,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>
                    *)&local_ac8);
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.array +
       0x90;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 6;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x10] = (double)(X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_data;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = (double)(X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                     .m_cols;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[1] = (double)((long)local_ac8.m_lu.
                            super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
                            m_storage.m_data.array[0x10] + 0x10);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[10] = (double)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_cols;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x10] = (double)((long)local_ac8.m_lu.
                               super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
                               m_storage.m_data.array[0x10] + 8);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[8] = (double)((u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                      m_storage.m_data + 1);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[5] = 9.88131291682493e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xc] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xd] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xe] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x14] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x15] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x16] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[4] = (double)X;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xb] = (double)u;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x12] = local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
                m_storage.m_data.array[3];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x13] = (double)X;
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>>
            (local_1090,
             (Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>
              *)&n,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>
                    *)&local_ac8);
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       A.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.array +
       0x96;
  n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 6;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0] = (double)(X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                     .m_data;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[2] = (double)(X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage
                     .m_cols;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xe] = (double)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_data;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x10] = (double)(u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                        m_storage.m_cols;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = (double)((long)local_ac8.m_lu.
                            super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
                            m_storage.m_data.array[0] + 0x10);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[4] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[5] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xb] = 9.88131291682493e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xc] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xd] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x12] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x13] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x14] = 4.94065645841247e-324;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = (double)X;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
             m_storage.m_data.array[2];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[10] = (double)X;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0x11] = (double)u;
  Eigen::
  CommaInitializer<Eigen::Block<Eigen::Block<Eigen::Matrix<double,12,13,0,12,13>,12,1,true>,-1,1,false>>
  ::
  CommaInitializer<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const,Eigen::ArrayWrapper<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>const,1,_1,false>const>const>const>const>>
            (local_10b0,
             (Block<Eigen::Block<Eigen::Matrix<double,_12,_13,_0,_12,_13>,_12,_1,_true>,__1,_1,_false>
              *)&n,(DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>,_const_Eigen::ArrayWrapper<const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1,__1,_false>_>_>_>_>_>
                    *)&local_ac8);
  Eigen::FullPivLU<Eigen::Matrix<double,12,13,0,12,13>>::
  FullPivLU<Eigen::Matrix<double,12,13,0,12,13>>
            (&local_ac8,(EigenBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_> *)&A);
  Eigen::internal::kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>_>
  ::kernel_retval_base
            ((kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>_> *)&v,
             &local_ac8);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::internal::kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<double,12,13,0,12,13>>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&n,
             (ReturnByValue<Eigen::internal::kernel_retval_base<Eigen::FullPivLU<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>_>_>
              *)&v);
  dVar4 = (double)(long)((int)n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                              m_storage.m_cols + -1);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0] = (double)(n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data + (long)dVar4 *
                               n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_rows);
  dVar1 = *(double *)
           ((long)local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
                  m_storage.m_data.array[0] + 0x60);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[1] = 1.48219693752374e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[4] = (double)n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = (double)n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[10] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xc] = (double)n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_rows;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xd] = 1.48219693752374e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.
             m_storage.m_data.array[0];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = (double)&n;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[8] = dVar4;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xf] = dVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&v,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_ac8);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = (double)(n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data + n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_rows * (long)dVar4);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0] = (double)(n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data + n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_rows * (long)dVar4 + 3);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[1] = 1.48219693752374e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[4] = (double)n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = (double)n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[10] = 1.48219693752374e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xc] = (double)n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_rows;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xd] = 1.48219693752374e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = (double)&n;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[8] = dVar4;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xf] = dVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&w,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_ac8);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = (double)(n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data + n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_rows * (long)dVar4);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0] = (double)(n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data + n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_rows * (long)dVar4 + 6);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[1] = 1.48219693752374e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[4] = (double)n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = (double)n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[10] = 2.96439387504748e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xc] = (double)n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_rows;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xd] = 1.48219693752374e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = (double)&n;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[8] = dVar4;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xf] = dVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&C,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_ac8);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = (double)(n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data + n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_rows * (long)dVar4);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0] = (double)(n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                      m_data + n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                               m_storage.m_rows * (long)dVar4 + 9);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[1] = 1.48219693752374e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[4] = (double)n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = 0.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = (double)n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                     m_rows;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[10] = 4.44659081257122e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xc] = (double)n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_rows;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xd] = 1.48219693752374e-323;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = (double)&n;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[8] = dVar4;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xf] = dVar1;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>>::
  _set_noalias<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,_1,1,false>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<double,3,1,0,3,1>> *)&t,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)&local_ac8);
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[2] = v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [2];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0] = v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [0];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[1] = v.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [1];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[3] = C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [0];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[4] = C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [1];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[5] = C.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [2];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[6] = w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [0];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[7] = w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [1];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[8] = w.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [2];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[9] = t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
             [0];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[10] = t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [1];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xb] = t.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
               [2];
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xc] = 1.0;
  local_ac8.m_lu.super_PlainObjectBase<Eigen::Matrix<double,_12,_13,_0,_12,_13>_>.m_storage.m_data.
  array[0xd] = 0.0;
  std::vector<RSDoublelinCameraPose,_std::allocator<RSDoublelinCameraPose>_>::
  emplace_back<RSDoublelinCameraPose>(results,(RSDoublelinCameraPose *)&local_ac8);
  free(n.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
  return 0;
}

Assistant:

int R6PIter(const Eigen::MatrixXd & X, const Eigen::MatrixXd & u, const Eigen::Vector3d & vk, double r0, RSDoublelinCameraPoseVector * results){
    Eigen::Matrix<double,12,13> A = Eigen::Matrix<double,12,13>::Zero();
    A.col(0).head(6) << X.row(2).transpose().array() + X.row(1).transpose().array() * u.row(1).transpose().array();  
    A.col(0).tail(6) << -X.row(1).transpose().array() * u.row(0).transpose().array();
    A.col(1).head(6) << -X.row(0).transpose().array() * u.row(1).transpose().array();
    A.col(1).tail(6) << X.row(2).transpose().array() + X.row(0).transpose().array() * u.row(0).transpose().array();
    A.col(2).head(6) << - X.row(0).transpose().array();
    A.col(2).tail(6) << - X.row(1).transpose().array();
    A.col(3).head(6) << X.row(0).transpose().array() * vk(1) * (-u.row(0).transpose().array()) - X.row(2).transpose().array() * (- u.row(0).transpose().array()) - u.row(1).transpose().array() * (X.row(1).transpose().array() * ( -u.row(0).transpose().array()) + X.row(0).transpose().array() * vk(2) * (-u.row(0).transpose().array()) - X.row(2).transpose().array() * vk(0) * (-u.row(0).transpose().array())) - X.row(1).transpose().array() * vk(0) * (-u.row(0).transpose().array());
    A.col(3).tail(6) << u.row(0).transpose().array() * (X.row(1).transpose().array() * (-u.row(0).transpose().array()) + X.row(0).transpose().array() * vk(2) * (-u.row(0).transpose().array()) - X.row(2).transpose().array() * vk(0) * (-u.row(0).transpose().array()));
    A.col(4).head(6) << u.row(1).transpose().array() * (X.row(0).transpose().array() * (-u.row(0).transpose().array()) - X.row(1).transpose().array() * vk(2) * (-u.row(0).transpose().array()) + X.row(2).transpose().array() * vk(1) * (-u.row(0).transpose().array()));
    A.col(4).tail(6) << X.row(0).transpose().array() * vk(1) * (-u.row(0).transpose().array()) - X.row(2).transpose().array() * (-u.row(0).transpose().array()) - u.row(0).transpose().array() * (X.row(0).transpose().array() * (-u.row(0).transpose().array()) -X.row(1).transpose().array() * vk(2) * (-u.row(0).transpose().array()) + X.row(2).transpose().array() * vk(1) * (-u.row(0).transpose().array())) - X.row(1).transpose().array() * vk(0) * (-u.row(0).transpose().array());
    A.col(5).head(6) << X.row(0).transpose().array() * (-u.row(0).transpose().array()) - X.row(1).transpose().array() * vk(2) * (-u.row(0).transpose().array()) + X.row(2).transpose().array() * vk(1) * (-u.row(0).transpose().array());
    A.col(5).tail(6) << X.row(1).transpose().array() * (-u.row(0).transpose().array()) + X.row(0).transpose().array() * vk(2) * (-u.row(0).transpose().array()) - X.row(2).transpose().array() * vk(0) * (-u.row(0).transpose().array());
    A.col(6).tail(6) << Eigen::MatrixXd::Ones(6,1);
    A.col(7).head(6) << -Eigen::MatrixXd::Ones(6,1);
    A.col(8).head(6) << u.row(1).transpose().array();
    A.col(8).tail(6) << -u.row(0).transpose().array();
    A.col(9).tail(6) << u.row(0).transpose().array();
    A.col(10).head(6) << -u.row(0).transpose().array();
    A.col(11).head(6) << -u.row(1).transpose().array() * (-u.row(0).transpose().array());
    A.col(11).tail(6) << u.row(0).transpose().array() * (-u.row(0).transpose().array());
    A.col(12).head(6) << X.row(2).transpose().array() * u.row(1).transpose().array() - X.row(1).transpose().array();
    A.col(12).tail(6) << X.row(0).transpose().array() - X.row(2).transpose().array() * u.row(0).transpose().array();
    Eigen::MatrixXd n = A.fullPivLu().kernel();
    // std::cout << "A inverse done \n";
    int end = n.cols()-1;
    double s = n(12,end);
    // std::cout << "scalar done \n";
    Eigen::Vector3d v = n.col(end).head(3)/s; 
    // std::cout << "v: \n" << v << "\n";
    Eigen::Vector3d w = n.col(end).segment(3,3)/s;
    // std::cout << "w done \n" << w << "\n";
    Eigen::Vector3d C = n.col(end).segment(6,3)/s;
    // std::cout << "C done \n" << C << "\n";
    Eigen::Vector3d t = n.col(end).segment(9,3)/s;
    // std::cout << "t done \n" << t << "\n";

    results->push_back({v, C, w, t, 1, 0});

    return 0;

}